

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adopt.c
# Opt level: O1

lws * adopt_socket_readbuf(lws *wsi,char *readbuf,size_t len)

{
  short *psVar1;
  pollfd *pollfd;
  lws_dll2_owner *owner;
  char cVar2;
  lws_context *plVar3;
  int iVar4;
  
  if (wsi != (lws *)0x0) {
    if (len == 0 || readbuf == (char *)0x0) {
      return wsi;
    }
    if (wsi->position_in_fds_table == -1) {
      return wsi;
    }
    plVar3 = wsi->context;
    cVar2 = wsi->tsi;
    iVar4 = lws_buflist_append_segment(&wsi->buflist,(uint8_t *)readbuf,len);
    if (-1 < iVar4) {
      owner = &plVar3->pt[cVar2].dll_buflist_owner;
      if (iVar4 != 0) {
        lws_dll2_add_head(&wsi->dll_buflist,owner);
      }
      if (((wsi->http).ah == (allocated_headers *)0x0) &&
         (iVar4 = lws_header_table_attach(wsi,0), iVar4 != 0)) {
        _lws_log(1,"%s: deferring handling ah\n","adopt_socket_readbuf");
        return wsi;
      }
      _lws_log(4,"%s: calling service on readbuf ah\n","adopt_socket_readbuf");
      pollfd = (pollfd *)(*(long *)&owner[0xc].count + (long)wsi->position_in_fds_table * 8);
      psVar1 = &pollfd->revents;
      *psVar1 = *psVar1 | 1;
      _lws_log(1,"%s: calling service\n","adopt_socket_readbuf");
      iVar4 = lws_service_fd_tsi(wsi->context,pollfd,(int)wsi->tsi);
      if (iVar4 == 0) {
        return wsi;
      }
      return (lws *)0x0;
    }
    lws_close_free_wsi(wsi,LWS_CLOSE_STATUS_NOSTATUS,"adopt skt readbuf fail");
  }
  return (lws *)0x0;
}

Assistant:

static struct lws*
adopt_socket_readbuf(struct lws *wsi, const char *readbuf, size_t len)
{
	struct lws_context_per_thread *pt;
	struct lws_pollfd *pfd;
	int n;

	if (!wsi)
		return NULL;

	if (!readbuf || len == 0)
		return wsi;

	if (wsi->position_in_fds_table == LWS_NO_FDS_POS)
		return wsi;

	pt = &wsi->context->pt[(int)wsi->tsi];

	n = lws_buflist_append_segment(&wsi->buflist, (const uint8_t *)readbuf,
				       len);
	if (n < 0)
		goto bail;
	if (n)
		lws_dll2_add_head(&wsi->dll_buflist, &pt->dll_buflist_owner);

	/*
	 * we can't process the initial read data until we can attach an ah.
	 *
	 * if one is available, get it and place the data in his ah rxbuf...
	 * wsi with ah that have pending rxbuf get auto-POLLIN service.
	 *
	 * no autoservice because we didn't get a chance to attach the
	 * readbuf data to wsi or ah yet, and we will do it next if we get
	 * the ah.
	 */
	if (wsi->http.ah || !lws_header_table_attach(wsi, 0)) {

		lwsl_notice("%s: calling service on readbuf ah\n", __func__);

		/*
		 * unlike a normal connect, we have the headers already
		 * (or the first part of them anyway).
		 * libuv won't come back and service us without a network
		 * event, so we need to do the header service right here.
		 */
		pfd = &pt->fds[wsi->position_in_fds_table];
		pfd->revents |= LWS_POLLIN;
		lwsl_err("%s: calling service\n", __func__);
		if (lws_service_fd_tsi(wsi->context, pfd, wsi->tsi))
			/* service closed us */
			return NULL;

		return wsi;
	}
	lwsl_err("%s: deferring handling ah\n", __func__);

	return wsi;

bail:
	lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS,
			   "adopt skt readbuf fail");

	return NULL;
}